

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.h
# Opt level: O3

color_rgba __thiscall
basisu::etc_block::get_block_color(etc_block *this,uint32_t subblock_index,bool scaled)

{
  byte bVar1;
  undefined8 in_RAX;
  byte bVar2;
  ushort packed_color5;
  byte bVar3;
  color_rgba b;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_4;
  
  local_4 = SUB84((ulong)in_RAX >> 0x20,0);
  bVar1 = (this->field_0).m_bytes[0];
  if (((this->field_0).m_bytes[3] & 2) == 0) {
    if (subblock_index == 0) {
      bVar1 = bVar1 >> 4;
      bVar2 = (this->field_0).m_bytes[1] >> 4;
      bVar3 = (this->field_0).m_bytes[2] >> 4;
    }
    else {
      bVar1 = bVar1 & 0xf;
      bVar2 = (this->field_0).m_bytes[1] & 0xf;
      bVar3 = (this->field_0).m_bytes[2] & 0xf;
    }
    local_4.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         unpack_color4(CONCAT11(bVar1,bVar2 << 4 | bVar3),scaled,0xff);
  }
  else {
    packed_color5 =
         (ushort)((bVar1 & 0xf8) << 7) |
         (ushort)((this->field_0).m_bytes[2] >> 3) + ((this->field_0).m_bytes[1] & 0xfff8) * 4;
    if (subblock_index == 0) {
      unpack_color5((color_rgba *)&local_4.field_1,packed_color5,scaled);
    }
    else {
      unpack_color5((color_rgba *)&local_4.field_1,packed_color5,
                    (ushort)((bVar1 & 7) << 6) |
                    ((this->field_0).m_bytes[2] & 7) + ((this->field_0).m_bytes[1] & 7) * 8,scaled,
                    0xff);
    }
  }
  return (anon_union_4_2_6eba8969_for_color_rgba_0)
         (anon_union_4_2_6eba8969_for_color_rgba_0)local_4.field_1;
}

Assistant:

color_rgba get_block_color(uint32_t subblock_index, bool scaled) const
		{
			color_rgba b;

			if (get_diff_bit())
			{
				if (subblock_index)
					unpack_color5(b, get_base5_color(), get_delta3_color(), scaled);
				else
					unpack_color5(b, get_base5_color(), scaled);
			}
			else
			{
				b = unpack_color4(get_base4_color(subblock_index), scaled);
			}

			return b;
		}